

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArraySet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArraySet *curr)

{
  uint uVar1;
  Literal *pLVar2;
  long lVar3;
  ulong uVar4;
  shared_ptr<wasm::GCData> sVar5;
  undefined1 local_158 [8];
  Flow ref;
  Flow index;
  Flow value;
  undefined1 auStack_78 [8];
  Field field;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined1 local_38 [8];
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_158,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,curr->index);
    if (index.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&index.breakTo.super_IString.str._M_str,this,curr->value);
      if (value.breakTo.super_IString.str._M_len == 0) {
        Flow::getSingleValue((Flow *)local_158);
        sVar5 = Literal::getGCData((Literal *)local_38);
        if (local_38 == (undefined1  [8])0x0) {
          (*this->_vptr_ExpressionRunner[2])
                    (this,"null ref",
                     sVar5.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi._M_pi);
        }
        pLVar2 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
        uVar1 = Literal::geti32(pLVar2);
        uVar4 = (ulong)uVar1;
        lVar3 = (long)(((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar3 / 0x18 +
            (((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed <=
            uVar4) {
          (*this->_vptr_ExpressionRunner[2])(this,"array oob",lVar3 % 0x18);
        }
        wasm::Type::getHeapType(&curr->ref->type);
        HeapType::getArray((HeapType *)&local_50.func);
        auStack_78 = (undefined1  [8])local_50.i64;
        field.type.id =
             (uintptr_t)
             local_50.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        pLVar2 = Flow::getSingleValue((Flow *)&index.breakTo.super_IString.str._M_str);
        Literal::Literal((Literal *)&field.packedType,pLVar2);
        truncateForPacking((Literal *)&local_50.func,this,(Literal *)&field.packedType,
                           (Field *)auStack_78);
        pLVar2 = (((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                 flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar4 - 1);
        if (uVar4 == 0) {
          pLVar2 = (((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed
                   ._M_elems;
        }
        Literal::operator=(pLVar2,(Literal *)&local_50.func);
        Literal::~Literal((Literal *)&local_50.func);
        Literal::~Literal((Literal *)&field.packedType);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&index.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&index.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_158);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_158);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArraySet(ArraySet* curr) {
    NOTE_ENTER("ArraySet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    Index i = index.getSingleValue().geti32();
    if (i >= data->values.size()) {
      trap("array oob");
    }
    auto field = curr->ref->type.getHeapType().getArray().element;
    data->values[i] = truncateForPacking(value.getSingleValue(), field);
    return Flow();
  }